

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementAssembly::~IfcElementAssembly(IfcElementAssembly *this)

{
  ~IfcElementAssembly((IfcElementAssembly *)
                      &this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10);
  return;
}

Assistant:

IfcElementAssembly() : Object("IfcElementAssembly") {}